

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O1

uint8_t * google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                    (int field_number,uint32_t value,uint8_t *target)

{
  bool bVar1;
  byte *pbVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  
  uVar5 = field_number << 3;
  *target = (byte)uVar5;
  if (uVar5 < 0x80) {
    pbVar4 = target + 1;
  }
  else {
    *target = (byte)uVar5 | 0x80;
    target[1] = (uint8_t)(uVar5 >> 7);
    pbVar4 = target + 2;
    if (0x3fff < uVar5) {
      uVar3 = (uint)target[1];
      uVar5 = uVar5 >> 7;
      do {
        pbVar4[-1] = (byte)uVar3 | 0x80;
        uVar3 = uVar5 >> 7;
        *pbVar4 = (byte)uVar3;
        pbVar4 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar3;
      } while (bVar1);
    }
  }
  *pbVar4 = (byte)value;
  if (value < 0x80) {
    return pbVar4 + 1;
  }
  *pbVar4 = (byte)value | 0x80;
  pbVar4[1] = (byte)(value >> 7);
  pbVar2 = pbVar4 + 2;
  if (0x3fff < value) {
    uVar3 = (uint)pbVar4[1];
    uVar5 = value >> 7;
    do {
      pbVar2[-1] = (byte)uVar3 | 0x80;
      uVar3 = uVar5 >> 7;
      *pbVar2 = (byte)uVar3;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar5;
      uVar5 = uVar3;
    } while (bVar1);
  }
  return pbVar2;
}

Assistant:

constexpr inline uint32_t WireFormatLite::MakeTag(int field_number,
                                                  WireType type) {
  return GOOGLE_PROTOBUF_WIRE_FORMAT_MAKE_TAG(field_number, type);
}